

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::SOLHandler_Easy::OnDualSolution<mp::VecReader<double>>
          (SOLHandler_Easy *this,VecReader<double> *rd)

{
  int iVar1;
  NLSolution *pNVar2;
  pointer pdVar3;
  iterator __position;
  double in_RAX;
  double local_28;
  
  pNVar2 = this->sol_;
  pdVar3 = (pNVar2->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pNVar2->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    (pNVar2->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
    ._M_finish = pdVar3;
  }
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (&pNVar2->y_,
             (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_logical_cons +
             (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_algebraic_cons);
  iVar1 = rd->n_;
  while (iVar1 != 0) {
    pNVar2 = this->sol_;
    local_28 = VecReader<double>::ReadNext(rd);
    __position._M_current =
         (pNVar2->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pNVar2->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&pNVar2->y_,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (pNVar2->y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    iVar1 = rd->n_;
  }
  return;
}

Assistant:

void OnDualSolution(VecReader& rd) {
    sol_.y_.clear();
    sol_.y_.reserve(header_.num_algebraic_cons
                    + header_.num_logical_cons);
    while (rd.Size())         // No permutation
      sol_.y_.push_back(rd.ReadNext());
  }